

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void CheckDeprecated(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  
  if (((node != (Node *)0x0) && (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2)) &&
     (node->tag != (Dict *)0x0)) {
    TVar1 = node->tag->id;
    if (TVar1 == TidyTag_APPLET) {
      prvTidyReportAccessError(doc,node,0x2f4);
      return;
    }
    if (TVar1 == TidyTag_U) {
      prvTidyReportAccessError(doc,node,0x2fd);
      return;
    }
    if (TVar1 == TidyTag_CENTER) {
      prvTidyReportAccessError(doc,node,0x2f6);
      return;
    }
    if (TVar1 == TidyTag_DIR) {
      prvTidyReportAccessError(doc,node,0x2f7);
      return;
    }
    if (TVar1 == TidyTag_FONT) {
      prvTidyReportAccessError(doc,node,0x2f8);
      return;
    }
    if (TVar1 == TidyTag_ISINDEX) {
      prvTidyReportAccessError(doc,node,0x2f9);
      return;
    }
    if (TVar1 == TidyTag_MENU) {
      prvTidyReportAccessError(doc,node,0x2fa);
      return;
    }
    if (TVar1 == TidyTag_S) {
      prvTidyReportAccessError(doc,node,0x2fb);
      return;
    }
    if (TVar1 == TidyTag_STRIKE) {
      prvTidyReportAccessError(doc,node,0x2fc);
      return;
    }
    if (TVar1 == TidyTag_BASEFONT) {
      prvTidyReportAccessError(doc,node,0x2f5);
      return;
    }
  }
  return;
}

Assistant:

static void CheckDeprecated( TidyDocImpl* doc, Node* node )
{
    if (Level2_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsAPPLET(node) )
            msgcode = REPLACE_DEPRECATED_HTML_APPLET;
        else if ( nodeIsBASEFONT(node) )
            msgcode = REPLACE_DEPRECATED_HTML_BASEFONT;
        else if ( nodeIsCENTER(node) )
            msgcode = REPLACE_DEPRECATED_HTML_CENTER;
        else if ( nodeIsDIR(node) )
            msgcode = REPLACE_DEPRECATED_HTML_DIR;
        else if ( nodeIsFONT(node) )
            msgcode = REPLACE_DEPRECATED_HTML_FONT;
        else if ( nodeIsISINDEX(node) )
            msgcode = REPLACE_DEPRECATED_HTML_ISINDEX;
        else if ( nodeIsMENU(node) )
            msgcode = REPLACE_DEPRECATED_HTML_MENU;
        else if ( nodeIsS(node) )
            msgcode = REPLACE_DEPRECATED_HTML_S;
        else if ( nodeIsSTRIKE(node) )
            msgcode = REPLACE_DEPRECATED_HTML_STRIKE;
        else if ( nodeIsU(node) )
            msgcode = REPLACE_DEPRECATED_HTML_U;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}